

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.h
# Opt level: O0

void gen_uc_tracecode(TCGContext_conflict9 *tcg_ctx,int32_t size,int32_t type,void *uc,uint64_t pc)

{
  TCGv_i32 v;
  TCGv_i64 v_00;
  TCGv_i64 v_01;
  TCGv_i64 v_02;
  TCGv_i32 arg2;
  TCGTemp *local_88;
  TCGTemp *args [4];
  hook *hk;
  list_item *cur;
  uc_struct *puc;
  TCGv_ptr tdata;
  TCGv_i64 tpc;
  TCGv_ptr tuc;
  TCGv_i32 ttype;
  TCGv_i32 tsize;
  uint64_t pc_local;
  void *uc_local;
  int32_t type_local;
  int32_t size_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  v = tcg_const_i32_tricore(tcg_ctx,size);
  v_00 = tcg_const_i64_tricore(tcg_ctx,(int64_t)uc);
  v_01 = tcg_const_i64_tricore(tcg_ctx,pc);
  local_88 = tcgv_ptr_temp(tcg_ctx,(TCGv_ptr)v_00);
  args[0] = tcgv_i64_temp(tcg_ctx,v_01);
  args[1] = tcgv_i32_temp(tcg_ctx,v);
  args[2] = (TCGTemp *)0x0;
  if (*(int *)((long)uc + (long)type * 4 + 0x4f0) == 1) {
    for (hk = *(hook **)((long)uc + (long)type * 0x18 + 0x328); hk != (hook *)0x0; hk = *(hook **)hk
        ) {
      args[3] = *(TCGTemp **)&hk->refs;
      if (((ulong)args[3]->mem_base & 0x100000000) == 0) {
        v_02 = tcg_const_i64_tricore(tcg_ctx,(int64_t)args[3]->state_ptr);
        args[2] = tcgv_ptr_temp(tcg_ctx,(TCGv_ptr)v_02);
        (**(code **)((long)uc + 0x178))(uc,args[3],&local_88,4);
        tcg_temp_free_ptr(tcg_ctx,(TCGv_ptr)v_02);
      }
    }
  }
  else {
    arg2 = tcg_const_i32_tricore(tcg_ctx,type);
    gen_helper_uc_tracecode(tcg_ctx,v,arg2,(TCGv_ptr)v_00,v_01);
    tcg_temp_free_i32(tcg_ctx,arg2);
  }
  tcg_temp_free_i64(tcg_ctx,v_01);
  tcg_temp_free_ptr(tcg_ctx,(TCGv_ptr)v_00);
  tcg_temp_free_i32(tcg_ctx,v);
  return;
}

Assistant:

static inline void gen_uc_tracecode(TCGContext *tcg_ctx, int32_t size, int32_t type, void *uc, uint64_t pc)
{
    TCGv_i32 tsize = tcg_const_i32(tcg_ctx, size);
    TCGv_i32 ttype;
    TCGv_ptr tuc = tcg_const_ptr(tcg_ctx, uc);
    TCGv_i64 tpc = tcg_const_i64(tcg_ctx, pc);
    TCGv_ptr tdata;
    uc_engine* puc = uc;
    struct list_item *cur;
    struct hook* hk;
    TCGTemp* args[] = {
        tcgv_ptr_temp(tcg_ctx, tuc),
        tcgv_i64_temp(tcg_ctx, tpc),
        tcgv_i32_temp(tcg_ctx, tsize),
        0
    };

    if (puc->hooks_count[type] == 1) {
        cur = puc->hook[type].head;
        
        while (cur) {
            hk = cur->data;
            if (!hk->to_delete) {
                tdata = tcg_const_ptr(tcg_ctx, hk->user_data);
                args[3] = tcgv_ptr_temp(tcg_ctx, tdata);
                puc->add_inline_hook(uc, hk, (void**)args, 4);
                tcg_temp_free_ptr(tcg_ctx, tdata);
            }
            cur = cur->next;
        }

    } else {
        ttype = tcg_const_i32(tcg_ctx, type);
        gen_helper_uc_tracecode(tcg_ctx, tsize, ttype, tuc, tpc);
        tcg_temp_free_i32(tcg_ctx, ttype);
    }
    tcg_temp_free_i64(tcg_ctx, tpc);
    tcg_temp_free_ptr(tcg_ctx, tuc);
    tcg_temp_free_i32(tcg_ctx, tsize);
}